

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_table_filter.cpp
# Opt level: O1

unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> __thiscall
duckdb::ExpressionFilter::Deserialize(ExpressionFilter *this,Deserializer *deserializer)

{
  int iVar1;
  ExpressionFilter *this_00;
  pointer *__ptr;
  Expression *pEVar2;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_28;
  Expression *local_20;
  
  iVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,200,"expr");
  pEVar2 = (Expression *)0x0;
  if ((char)iVar1 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
  }
  else {
    iVar1 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar1 == '\0') {
      pEVar2 = (Expression *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      Expression::Deserialize((Expression *)&stack0xffffffffffffffe0,deserializer);
      (*deserializer->_vptr_Deserializer[7])(deserializer);
      pEVar2 = local_20;
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  this_00 = (ExpressionFilter *)operator_new(0x18);
  local_28._M_head_impl = pEVar2;
  ExpressionFilter(this_00,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            *)&local_28);
  if (local_28._M_head_impl != (Expression *)0x0) {
    (*((local_28._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  (this->super_TableFilter)._vptr_TableFilter = (_func_int **)this_00;
  return (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>)
         (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>)this;
}

Assistant:

unique_ptr<TableFilter> ExpressionFilter::Deserialize(Deserializer &deserializer) {
	auto expr = deserializer.ReadPropertyWithDefault<unique_ptr<Expression>>(200, "expr");
	auto result = duckdb::unique_ptr<ExpressionFilter>(new ExpressionFilter(std::move(expr)));
	return std::move(result);
}